

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseNumber(Lexer *this)

{
  byte bVar1;
  Lexer *this_00;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  double number;
  double local_58;
  String local_50;
  
  pcVar6 = this->m_current;
  uVar5 = (uint)(*pcVar6 == '.');
  sVar3 = GetUtf8CharSize(pcVar6);
  this->m_current = this->m_current + sVar3;
  this->m_columnNumber = this->m_columnNumber + 1;
  do {
    this_00 = (Lexer *)this->m_current;
    bVar1 = *(byte *)&(this_00->m_name)._M_dataplus._M_p;
    if ((bVar1 == 0) || ((Lexer *)this->m_end < this_00)) break;
    bVar7 = bVar1 - 0x30 < 10;
    if (bVar1 == 0x2e || bVar7) {
      uVar5 = uVar5 + (bVar1 == 0x2e);
      sVar3 = GetUtf8CharSize((char *)this_00);
      this->m_current = this->m_current + sVar3;
      this->m_columnNumber = this->m_columnNumber + 1;
    }
    else {
      bVar2 = IsName(this_00,(char *)this_00);
      if (bVar2) {
        Error<>(this,"Invalid number format");
      }
    }
  } while (bVar1 == 0x2e || bVar7);
  if ((int)uVar5 < 2) {
    if (uVar5 == 0) {
      local_58 = 0.0;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_50,pcVar6
                 ,this->m_current);
      bVar7 = StringToInteger(&local_50,(int64_t *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        CreateSymbol(this,(int64_t)local_58);
        return;
      }
      pcVar6 = "Invalid integer format: unable to convert string to integer";
    }
    else {
      lVar4 = (long)this->m_current - (long)pcVar6;
      if (lVar4 < 2) {
        pcVar6 = "Invalid number format: no digits after decimal place";
        goto LAB_001f89a0;
      }
      local_58 = 0.0;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_50,pcVar6
                 ,pcVar6 + lVar4);
      bVar7 = StringToNumber(&local_50,&local_58,International);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        CreateSymbol(this,local_58);
        return;
      }
      pcVar6 = "Invalid number format: unable to convert string to double";
    }
    Error<>(this,pcVar6);
    return;
  }
  pcVar6 = "Invalid number format: too many decimal places";
LAB_001f89a0:
  Error<>(this,pcVar6);
  return;
}

Assistant:

inline_t void Lexer::ParseNumber()
	{
		const char * startNum = m_current;
		int points = 0;
		if (*startNum == '.')
			points = 1;
		AdvanceCurrent();
		while (!IsEndOfText())
		{
			char c = *m_current;
			if (!IsNumber(c))
			{
				if (IsName(m_current))
				{
					Error("Invalid number format");
					break;
				}
				else
				{
					break;
				}
			}
			if (c == '.')
				++points;
			AdvanceCurrent();
		}
		if (points > 1)
			Error("Invalid number format: too many decimal places");
		else if (points == 0)
		{
			int64_t integer = 0;
			if (!StringToInteger(String(startNum, m_current - startNum), &integer))
			{
				Error("Invalid integer format: unable to convert string to integer");
				return;
			}
			CreateSymbol(integer);
		}
		else
		{
			if (m_current - startNum <= 1)
			{
				Error("Invalid number format: no digits after decimal place");
				return;
			}
			double number = 0.0f;
			if (!StringToNumber(String(startNum, m_current - startNum), &number))
			{
				Error("Invalid number format: unable to convert string to double");
				return;
			}
			CreateSymbol(number);
		}
	}